

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

UChar32 __thiscall icu_63::anon_unknown_16::NFDIterator::nextCodePoint(NFDIterator *this)

{
  int iVar1;
  uint local_1c;
  UChar32 c;
  NFDIterator *this_local;
  
  if (-1 < this->index) {
    if (this->index != this->length) {
      iVar1 = this->index;
      this->index = iVar1 + 1;
      local_1c = (uint)(ushort)this->decomp[iVar1];
      if ((local_1c & 0xfffffc00) == 0xd800) {
        iVar1 = this->index;
        this->index = iVar1 + 1;
        local_1c = local_1c * 0x400 + (uint)(ushort)this->decomp[iVar1] + 0xfca02400;
      }
      return local_1c;
    }
    this->index = -1;
  }
  iVar1 = (*(this->super_UObject)._vptr_UObject[3])();
  return iVar1;
}

Assistant:

UChar32 nextCodePoint() {
        if(index >= 0) {
            if(index == length) {
                index = -1;
            } else {
                UChar32 c;
                U16_NEXT_UNSAFE(decomp, index, c);
                return c;
            }
        }
        return nextRawCodePoint();
    }